

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_parse(REF_DBL *metric,REF_GRID ref_grid,int narg,char **args)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  uint uVar7;
  REF_NODE pRVar8;
  long lVar9;
  undefined8 uVar10;
  int iVar11;
  char *pcVar12;
  REF_DBL *pRVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Dd;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined4 uVar25;
  undefined4 uVar26;
  undefined1 auVar27 [16];
  double dVar28;
  REF_DBL geom [8];
  undefined8 local_158;
  undefined8 uStack_150;
  double local_148;
  double local_110;
  REF_DBL local_108 [3];
  double local_f0 [5];
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  char **local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (0 < narg) {
    iVar11 = 0;
    local_48 = 0;
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0x3ff00000;
    do {
      iVar6 = strncmp(args[iVar11],"--uniform",9);
      iVar15 = iVar11 + 1;
      if (iVar15 < narg && iVar6 == 0) {
        pcVar12 = args[iVar15];
        if (*pcVar12 == 'c') {
          if ((pcVar12[1] == 'y') && (pcVar12[2] == 'l')) {
            if (narg <= iVar11 + 0xc) {
              pcVar12 = 
              "not enough arguments for\n  --uniform cyl {ceil,floor} h0 decay_distance x1 y1 z1 x2 y2 z2 r1 r2"
              ;
              uVar10 = 0xd59;
              goto LAB_001ce06f;
            }
            pcVar12 = args[(long)iVar11 + 2];
            iVar6 = strncmp(pcVar12,"ceil",4);
            if ((iVar6 != 0) && (iVar15 = strncmp(pcVar12,"floor",5), iVar15 != 0)) {
              pcVar12 = 
              "ceil or floor is missing\n  --uniform cyl {ceil,floor} h0 decay_distance x1 y1 z1 x2 y2 z2 r1 r2"
              ;
              uVar10 = 0xd5e;
              goto LAB_001ce06f;
            }
            dVar21 = atof(args[(long)iVar11 + 3]);
            dVar2 = atof(args[(long)iVar11 + 4]);
            local_148 = -dVar21;
            lVar14 = 0;
            do {
              dVar3 = atof(args[(iVar11 + 5) + lVar14]);
              local_108[lVar14] = dVar3;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 8);
            pRVar8 = ref_grid->node;
            iVar15 = iVar11 + 0xd;
            if (0 < pRVar8->max) {
              dVar21 = (double)(~-(ulong)(0.0 < dVar21) & (ulong)local_148 |
                               -(ulong)(0.0 < dVar21) & (ulong)dVar21);
              local_c8 = dVar2 * 1e+20;
              if (local_c8 <= -local_c8) {
                local_c8 = -local_c8;
              }
              uStack_c0 = 0;
              lVar14 = 0;
              lVar16 = 0;
              pRVar13 = metric;
              do {
                if (-1 < pRVar8->global[lVar16]) {
                  uVar7 = ref_metric_truncated_cone_dist
                                    (local_108,(REF_DBL *)((long)pRVar8->real + lVar14),&local_110);
                  dVar3 = local_110;
                  if (uVar7 != 0) {
                    pcVar12 = "trunc cone dist";
                    uVar10 = 0xd6d;
                    goto LAB_001cdfc6;
                  }
                  dVar23 = -local_110;
                  dVar28 = dVar23;
                  if (dVar23 <= local_110) {
                    dVar28 = local_110;
                  }
                  dVar22 = dVar21;
                  if (dVar28 < local_c8) {
                    dVar22 = exp2(dVar23 / dVar2);
                    dVar22 = dVar22 * dVar21;
                  }
                  uVar7 = ref_matrix_diag_m(pRVar13,&local_b8);
                  if (uVar7 != 0) {
                    pcVar12 = "decomp";
                    uVar10 = 0xd72;
                    goto LAB_001cdfc6;
                  }
                  dVar23 = 1.0 / (dVar22 * dVar22);
                  if (iVar6 == 0) {
                    dVar28 = dVar23;
                    if (dVar23 <= local_b8) {
                      dVar28 = local_b8;
                    }
                    dVar22 = dVar23;
                    if (dVar23 <= local_b0) {
                      dVar22 = local_b0;
                    }
                    local_b8 = dVar28;
                    local_b0 = dVar22;
                    if (dVar23 <= local_a8) {
                      dVar23 = local_a8;
                    }
                  }
                  else {
                    dVar28 = dVar23;
                    if (local_b8 <= dVar23) {
                      dVar28 = local_b8;
                    }
                    dVar22 = dVar23;
                    if (local_b0 <= dVar23) {
                      dVar22 = local_b0;
                    }
                    local_b8 = dVar28;
                    local_b0 = dVar22;
                    if (local_a8 <= dVar23) {
                      dVar23 = local_a8;
                    }
                  }
                  local_a8 = dVar23;
                  uVar7 = ref_matrix_form_m(&local_b8,pRVar13);
                  if (uVar7 != 0) {
                    pcVar12 = "reform";
                    uVar10 = 0xd82;
                    goto LAB_001cdfc6;
                  }
                  if (ref_grid->twod != 0) {
                    pRVar13[2] = 0.0;
                    pRVar13[4] = (REF_DBL)CONCAT44(uStack_44,local_48);
                    pRVar13[5] = (REF_DBL)CONCAT44(uStack_3c,uStack_40);
                  }
                  local_158._0_4_ = SUB84(dVar3,0);
                  local_158._4_4_ = (undefined4)((ulong)dVar3 >> 0x20);
                  uStack_150._0_4_ = 0;
                  uStack_150._4_4_ = 0;
                }
                lVar16 = lVar16 + 1;
                pRVar8 = ref_grid->node;
                pRVar13 = pRVar13 + 6;
                lVar14 = lVar14 + 0x78;
              } while (lVar16 < pRVar8->max);
            }
          }
        }
        else if (((*pcVar12 == 'b') && (pcVar12[1] == 'o')) && (pcVar12[2] == 'x')) {
          if (narg <= iVar11 + 10) {
            pcVar12 = 
            "not enough arguments for\n  --uniform box {ceil,floor} h0 decay_distance xmin ymin zmin xmax ymax zmax"
            ;
            uVar10 = 0xd16;
LAB_001ce06f:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,uVar10,"ref_metric_parse",pcVar12);
            return 1;
          }
          pcVar12 = args[(long)iVar11 + 2];
          iVar15 = strncmp(pcVar12,"ceil",4);
          if ((iVar15 != 0) && (iVar6 = strncmp(pcVar12,"floor",5), iVar6 != 0)) {
            pcVar12 = 
            "ceil or floor is missing\n  --uniform box {ceil,floor} h0 decay_distance xmin ymin zmin xmax ymax zmax"
            ;
            uVar10 = 0xd1b;
            goto LAB_001ce06f;
          }
          dVar21 = atof(args[(long)iVar11 + 3]);
          dVar2 = atof(args[(long)iVar11 + 4]);
          local_148 = -dVar21;
          lVar14 = 0;
          do {
            dVar3 = atof(args[(iVar11 + 5) + lVar14]);
            local_108[lVar14] = dVar3;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 6);
          dVar21 = (double)(~-(ulong)(0.0 < dVar21) & (ulong)local_148 |
                           -(ulong)(0.0 < dVar21) & (ulong)dVar21);
          iVar6 = ref_grid->mpi->id;
          if (iVar15 == 0) {
            if (iVar6 == 0) {
              pcVar12 = "--uniform box ceil h0=%f decay=%f [%f %f %f %f %f %f]\n";
              goto LAB_001cdc79;
            }
          }
          else if (iVar6 == 0) {
            pcVar12 = "--uniform box floor h0=%f decay=%f [%f %f %f %f %f %f]\n";
LAB_001cdc79:
            local_148._0_4_ = SUB84(dVar21,0);
            printf(pcVar12,local_148._0_4_,dVar2,SUB84(local_108[0],0),local_108[1],local_108[2],
                   local_f0[0],local_f0[1],local_f0[2]);
          }
          pRVar8 = ref_grid->node;
          local_50 = args;
          if (0 < pRVar8->max) {
            local_c8 = dVar2 * 1e+20;
            dVar3 = (double)((ulong)local_c8 ^ (ulong)DAT_00211020);
            if (local_c8 <= dVar3) {
              local_c8 = dVar3;
            }
            uStack_c0 = 0;
            lVar16 = 0;
            lVar14 = 0;
            do {
              if (-1 < pRVar8->global[lVar14]) {
                uVar25 = 0;
                uVar26 = 0;
                uVar19 = 0;
                uVar20 = 0;
                lVar9 = 0;
                do {
                  dVar3 = *(double *)((long)pRVar8->real + lVar9 * 8 + lVar16);
                  dVar28 = dVar3 - local_f0[lVar9];
                  uVar17 = -(ulong)(local_f0[lVar9] < dVar3);
                  dVar23 = dVar3 - local_108[lVar9];
                  uVar18 = -(ulong)(dVar3 < local_108[lVar9]);
                  auVar27._0_8_ = ~uVar18 & CONCAT44(uVar26,uVar25);
                  auVar27._12_4_ = uVar20;
                  auVar27._8_4_ = uVar19;
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = (ulong)(dVar23 * dVar23 + (double)CONCAT44(uVar26,uVar25)) & uVar18
                  ;
                  auVar27 = auVar27 | auVar4;
                  auVar24._0_8_ = uVar17 & (ulong)(dVar28 * dVar28 + auVar27._0_8_);
                  auVar24._8_8_ = 0;
                  auVar1._8_4_ = auVar27._8_4_;
                  auVar1._0_8_ = ~uVar17 & (ulong)auVar27._0_8_;
                  auVar1._12_4_ = auVar27._12_4_;
                  auVar24 = auVar24 | auVar1;
                  local_158 = auVar24._0_8_;
                  uVar25 = auVar24._0_4_;
                  uVar26 = auVar24._4_4_;
                  uVar19 = auVar24._8_4_;
                  uVar20 = auVar24._12_4_;
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                if (local_158 < 0.0) {
                  local_158 = sqrt(local_158);
                  uVar25 = extraout_XMM0_Dc;
                  uVar26 = extraout_XMM0_Dd;
                }
                else {
                  uVar25 = 0;
                  uVar26 = 0;
                  local_158 = SQRT(local_158);
                }
                dVar3 = -local_158;
                auVar5._8_4_ = uVar25;
                auVar5._0_8_ = local_158;
                auVar5._12_4_ = uVar26;
                dVar23 = dVar3;
                if (dVar3 <= local_158) {
                  dVar23 = local_158;
                }
                dVar28 = dVar21;
                if (dVar23 < local_c8) {
                  dVar28 = exp2(dVar3 / dVar2);
                  dVar28 = dVar28 * dVar21;
                }
                pRVar13 = metric + lVar14 * 6;
                uVar7 = ref_matrix_diag_m(pRVar13,&local_b8);
                if (uVar7 != 0) {
                  pcVar12 = "decomp";
                  uVar10 = 0xd3b;
LAB_001cdfc6:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,uVar10,"ref_metric_parse",(ulong)uVar7,pcVar12);
                  return uVar7;
                }
                dVar3 = 1.0 / (dVar28 * dVar28);
                if (iVar15 == 0) {
                  dVar23 = dVar3;
                  if (dVar3 <= local_b8) {
                    dVar23 = local_b8;
                  }
                  dVar28 = dVar3;
                  if (dVar3 <= local_b0) {
                    dVar28 = local_b0;
                  }
                  local_b8 = dVar23;
                  local_b0 = dVar28;
                  if (dVar3 <= local_a8) {
                    dVar3 = local_a8;
                  }
                }
                else {
                  dVar23 = dVar3;
                  if (local_b8 <= dVar3) {
                    dVar23 = local_b8;
                  }
                  dVar28 = dVar3;
                  if (local_b0 <= dVar3) {
                    dVar28 = local_b0;
                  }
                  local_b8 = dVar23;
                  local_b0 = dVar28;
                  if (local_a8 <= dVar3) {
                    dVar3 = local_a8;
                  }
                }
                local_a8 = dVar3;
                uVar7 = ref_matrix_form_m(&local_b8,pRVar13);
                if (uVar7 != 0) {
                  pcVar12 = "reform";
                  uVar10 = 0xd4b;
                  goto LAB_001cdfc6;
                }
                if (ref_grid->twod != 0) {
                  pRVar13[2] = 0.0;
                  *(undefined4 *)(pRVar13 + 4) = local_48;
                  *(undefined4 *)((long)pRVar13 + 0x24) = uStack_44;
                  *(undefined4 *)(pRVar13 + 5) = uStack_40;
                  *(undefined4 *)((long)pRVar13 + 0x2c) = uStack_3c;
                }
                uStack_150 = auVar5._8_8_;
              }
              lVar14 = lVar14 + 1;
              pRVar8 = ref_grid->node;
              lVar16 = lVar16 + 0x78;
            } while (lVar14 < pRVar8->max);
          }
          args = local_50;
          iVar15 = iVar11 + 0xb;
          local_110 = local_158;
        }
      }
      iVar11 = iVar15;
    } while (iVar11 < narg);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_parse(REF_DBL *metric, REF_GRID ref_grid,
                                    int narg, char *args[]) {
  REF_INT i, node, pos;
  REF_DBL diag_system[12];
  REF_DBL h0, decay_distance;
  REF_DBL geom[8];
  REF_DBL r, h;
  REF_BOOL ceil;

  pos = 0;
  while (pos < narg) {
    if (strncmp(args[pos], "--uniform", 9) != 0) {
      pos++;
    } else {
      pos++;
      if (pos < narg && strncmp(args[pos], "box", 3) == 0) {
        pos++;
        RAS(pos + 8 < narg,
            "not enough arguments for\n"
            "  --uniform box {ceil,floor} h0 decay_distance xmin ymin zmin "
            "xmax ymax zmax");
        RAS(strncmp(args[pos], "ceil", 4) == 0 ||
                strncmp(args[pos], "floor", 5) == 0,
            "ceil or floor is missing\n"
            "  --uniform box {ceil,floor} h0 decay_distance xmin ymin zmin "
            "xmax ymax zmax");
        ceil = (strncmp(args[pos], "ceil", 4) == 0);
        pos++;
        h0 = atof(args[pos]);
        pos++;
        decay_distance = atof(args[pos]);
        pos++;
        h0 = ABS(h0); /* metric must be semi-positive definite */
        for (i = 0; i < 6; i++) {
          geom[i] = atof(args[pos]);
          pos++;
        }

        if (ceil) {
          if (ref_mpi_once(ref_grid_mpi(ref_grid)))
            printf("--uniform box ceil h0=%f decay=%f [%f %f %f %f %f %f]\n",
                   h0, decay_distance, geom[0], geom[1], geom[2], geom[3],
                   geom[4], geom[5]);
        } else {
          if (ref_mpi_once(ref_grid_mpi(ref_grid)))
            printf("--uniform box floor h0=%f decay=%f [%f %f %f %f %f %f]\n",
                   h0, decay_distance, geom[0], geom[1], geom[2], geom[3],
                   geom[4], geom[5]);
        }
        each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
          RSS(ref_metric_cart_box_dist(
                  geom, ref_node_xyz_ptr(ref_grid_node(ref_grid), node), &r),
              "box dist");
          h = h0;
          if (ref_math_divisible(-r, decay_distance)) {
            h = h0 * pow(2, -r / decay_distance);
          }
          RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "decomp");
          if (ceil) {
            ref_matrix_eig(diag_system, 0) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 0));
            ref_matrix_eig(diag_system, 1) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 1));
            ref_matrix_eig(diag_system, 2) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 2));
          } else {
            ref_matrix_eig(diag_system, 0) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 0));
            ref_matrix_eig(diag_system, 1) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 1));
            ref_matrix_eig(diag_system, 2) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 2));
          }
          RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform");
          if (ref_grid_twod(ref_grid)) {
            metric[2 + 6 * node] = 0.0;
            metric[4 + 6 * node] = 0.0;
            metric[5 + 6 * node] = 1.0;
          }
        }
        continue;
      }
      if (pos < narg && strncmp(args[pos], "cyl", 3) == 0) {
        pos++;
        RAS(pos + 10 < narg,
            "not enough arguments for\n"
            "  --uniform cyl {ceil,floor} h0 decay_distance x1 y1 z1 "
            "x2 y2 z2 r1 r2");
        RAS(strncmp(args[pos], "ceil", 4) == 0 ||
                strncmp(args[pos], "floor", 5) == 0,
            "ceil or floor is missing\n"
            "  --uniform cyl {ceil,floor} h0 decay_distance x1 y1 z1 "
            "x2 y2 z2 r1 r2");
        ceil = (strncmp(args[pos], "ceil", 4) == 0);
        pos++;
        h0 = atof(args[pos]);
        pos++;
        decay_distance = atof(args[pos]);
        pos++;
        h0 = ABS(h0); /* metric must be semi-positive definite */
        for (i = 0; i < 8; i++) {
          geom[i] = atof(args[pos]);
          pos++;
        }
        each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
          RSS(ref_metric_truncated_cone_dist(
                  geom, ref_node_xyz_ptr(ref_grid_node(ref_grid), node), &r),
              "trunc cone dist");
          h = h0;
          if (ref_math_divisible(-r, decay_distance)) {
            h = h0 * pow(2, -r / decay_distance);
          }
          RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "decomp");
          if (ceil) {
            ref_matrix_eig(diag_system, 0) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 0));
            ref_matrix_eig(diag_system, 1) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 1));
            ref_matrix_eig(diag_system, 2) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 2));
          } else {
            ref_matrix_eig(diag_system, 0) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 0));
            ref_matrix_eig(diag_system, 1) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 1));
            ref_matrix_eig(diag_system, 2) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 2));
          }
          RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform");
          if (ref_grid_twod(ref_grid)) {
            metric[2 + 6 * node] = 0.0;
            metric[4 + 6 * node] = 0.0;
            metric[5 + 6 * node] = 1.0;
          }
        }
        continue;
      }
    }
  }
  return REF_SUCCESS;
}